

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DocumentContext.cpp
# Opt level: O2

EStatusCode __thiscall
PDFHummus::DocumentContext::EndFormXObjectNoRelease
          (DocumentContext *this,PDFFormXObject *inFormXObject)

{
  ObjectsContext *pOVar1;
  EStatusCode EVar2;
  PDFStream *inStream;
  ObjectIDType inObjectID;
  ResourcesDictionary *inResourcesDictionary;
  iterator __position;
  iterator __position_00;
  _Base_ptr p_Var3;
  _Base_ptr *pp_Var4;
  _Base_ptr p_Var5;
  PDFFormXObject *local_38;
  
  pOVar1 = this->mObjectsContext;
  local_38 = inFormXObject;
  inStream = PDFFormXObject::GetContentStream(inFormXObject);
  EVar2 = ObjectsContext::EndPDFStream(pOVar1,inStream);
  if (EVar2 == eSuccess) {
    pOVar1 = this->mObjectsContext;
    inObjectID = PDFFormXObject::GetResourcesDictionaryObjectID(inFormXObject);
    EVar2 = ObjectsContext::StartNewIndirectObject(pOVar1,inObjectID);
    if (EVar2 == eSuccess) {
      inResourcesDictionary = PDFFormXObject::GetResourcesDictionary(inFormXObject);
      WriteResourcesDictionary(this,inResourcesDictionary);
      ObjectsContext::EndIndirectObject(this->mObjectsContext);
      __position = std::
                   _Rb_tree<PDFFormXObject_*,_std::pair<PDFFormXObject_*const,_std::__cxx11::list<IFormEndWritingTask_*,_std::allocator<IFormEndWritingTask_*>_>_>,_std::_Select1st<std::pair<PDFFormXObject_*const,_std::__cxx11::list<IFormEndWritingTask_*,_std::allocator<IFormEndWritingTask_*>_>_>_>,_std::less<PDFFormXObject_*>,_std::allocator<std::pair<PDFFormXObject_*const,_std::__cxx11::list<IFormEndWritingTask_*,_std::allocator<IFormEndWritingTask_*>_>_>_>_>
                   ::find(&(this->mFormEndTasks)._M_t,&local_38);
      if ((_Rb_tree_header *)__position._M_node !=
          &(this->mFormEndTasks)._M_t._M_impl.super__Rb_tree_header) {
        pp_Var4 = &__position._M_node[1]._M_parent;
        EVar2 = eSuccess;
        p_Var5 = (_Base_ptr)pp_Var4;
        while ((p_Var3 = (_Base_ptr)pp_Var4, EVar2 == eSuccess &&
               (p_Var5 = *(_Base_ptr *)p_Var5, p_Var5 != (_Base_ptr)pp_Var4))) {
          EVar2 = (**(code **)(*(long *)p_Var5->_M_left + 0x10))
                            (p_Var5->_M_left,local_38,this->mObjectsContext,this);
        }
        while (p_Var3 = *(_Base_ptr *)p_Var3, p_Var3 != (_Base_ptr)pp_Var4) {
          if (p_Var3->_M_left != (_Base_ptr)0x0) {
            (**(code **)(*(long *)p_Var3->_M_left + 8))();
          }
        }
        std::
        _Rb_tree<PDFFormXObject*,std::pair<PDFFormXObject*const,std::__cxx11::list<IFormEndWritingTask*,std::allocator<IFormEndWritingTask*>>>,std::_Select1st<std::pair<PDFFormXObject*const,std::__cxx11::list<IFormEndWritingTask*,std::allocator<IFormEndWritingTask*>>>>,std::less<PDFFormXObject*>,std::allocator<std::pair<PDFFormXObject*const,std::__cxx11::list<IFormEndWritingTask*,std::allocator<IFormEndWritingTask*>>>>>
        ::erase_abi_cxx11_((_Rb_tree<PDFFormXObject*,std::pair<PDFFormXObject*const,std::__cxx11::list<IFormEndWritingTask*,std::allocator<IFormEndWritingTask*>>>,std::_Select1st<std::pair<PDFFormXObject*const,std::__cxx11::list<IFormEndWritingTask*,std::allocator<IFormEndWritingTask*>>>>,std::less<PDFFormXObject*>,std::allocator<std::pair<PDFFormXObject*const,std::__cxx11::list<IFormEndWritingTask*,std::allocator<IFormEndWritingTask*>>>>>
                            *)&this->mFormEndTasks,__position);
        if (EVar2 != eSuccess) {
          return EVar2;
        }
      }
      __position_00 =
           std::
           _Rb_tree<PDFFormXObject_*,_std::pair<PDFFormXObject_*const,_std::__cxx11::list<IObjectEndWritingTask_*,_std::allocator<IObjectEndWritingTask_*>_>_>,_std::_Select1st<std::pair<PDFFormXObject_*const,_std::__cxx11::list<IObjectEndWritingTask_*,_std::allocator<IObjectEndWritingTask_*>_>_>_>,_std::less<PDFFormXObject_*>,_std::allocator<std::pair<PDFFormXObject_*const,_std::__cxx11::list<IObjectEndWritingTask_*,_std::allocator<IObjectEndWritingTask_*>_>_>_>_>
           ::find(&(this->mMoreFormEndTasks)._M_t,&local_38);
      if ((_Rb_tree_header *)__position_00._M_node ==
          &(this->mMoreFormEndTasks)._M_t._M_impl.super__Rb_tree_header) {
        EVar2 = eSuccess;
      }
      else {
        pp_Var4 = &__position_00._M_node[1]._M_parent;
        EVar2 = eSuccess;
        p_Var5 = (_Base_ptr)pp_Var4;
        while ((p_Var3 = (_Base_ptr)pp_Var4, EVar2 == eSuccess &&
               (p_Var5 = *(_Base_ptr *)p_Var5, p_Var5 != (_Base_ptr)pp_Var4))) {
          EVar2 = (**(code **)(*(long *)p_Var5->_M_left + 0x10))
                            (p_Var5->_M_left,this->mObjectsContext,this);
        }
        while (p_Var3 = *(_Base_ptr *)p_Var3, p_Var3 != (_Base_ptr)pp_Var4) {
          if (p_Var3->_M_left != (_Base_ptr)0x0) {
            (**(code **)(*(long *)p_Var3->_M_left + 8))();
          }
        }
        std::
        _Rb_tree<PDFFormXObject*,std::pair<PDFFormXObject*const,std::__cxx11::list<IObjectEndWritingTask*,std::allocator<IObjectEndWritingTask*>>>,std::_Select1st<std::pair<PDFFormXObject*const,std::__cxx11::list<IObjectEndWritingTask*,std::allocator<IObjectEndWritingTask*>>>>,std::less<PDFFormXObject*>,std::allocator<std::pair<PDFFormXObject*const,std::__cxx11::list<IObjectEndWritingTask*,std::allocator<IObjectEndWritingTask*>>>>>
        ::erase_abi_cxx11_((_Rb_tree<PDFFormXObject*,std::pair<PDFFormXObject*const,std::__cxx11::list<IObjectEndWritingTask*,std::allocator<IObjectEndWritingTask*>>>,std::_Select1st<std::pair<PDFFormXObject*const,std::__cxx11::list<IObjectEndWritingTask*,std::allocator<IObjectEndWritingTask*>>>>,std::less<PDFFormXObject*>,std::allocator<std::pair<PDFFormXObject*const,std::__cxx11::list<IObjectEndWritingTask*,std::allocator<IObjectEndWritingTask*>>>>>
                            *)&this->mMoreFormEndTasks,__position_00);
      }
    }
  }
  return EVar2;
}

Assistant:

EStatusCode DocumentContext::EndFormXObjectNoRelease(PDFFormXObject* inFormXObject)
{
	EStatusCode status = mObjectsContext->EndPDFStream(inFormXObject->GetContentStream());
	if(status != eSuccess)
		return status;

	// now write the resources dictionary, full of all the goodness that got accumulated over the stream write
	status = mObjectsContext->StartNewIndirectObject(inFormXObject->GetResourcesDictionaryObjectID());
	if(status != eSuccess)
		return status;
	WriteResourcesDictionary(inFormXObject->GetResourcesDictionary());
	mObjectsContext->EndIndirectObject();

    // now write writing tasks
	{
		PDFFormXObjectToIFormEndWritingTaskListMap::iterator it= mFormEndTasks.find(inFormXObject);

		if(it != mFormEndTasks.end())
		{
			IFormEndWritingTaskList::iterator itTasks = it->second.begin();

			for(; itTasks != it->second.end() && eSuccess == status; ++itTasks)
				status = (*itTasks)->Write(inFormXObject,mObjectsContext,this);

			// one time, so delete
			for(itTasks = it->second.begin(); itTasks != it->second.end(); ++itTasks)
				delete (*itTasks);
			mFormEndTasks.erase(it);
		}

	}
	if(status != eSuccess)
		return status;


	// and more writing tasks
	{
		PDFFormXObjectToIObjectEndWritingTaskListMap::iterator it= mMoreFormEndTasks.find(inFormXObject);

		if(it != mMoreFormEndTasks.end())
		{
			IObjectEndWritingTaskList::iterator itTasks = it->second.begin();

			for(; itTasks != it->second.end() && eSuccess == status; ++itTasks)
				status = (*itTasks)->Write(mObjectsContext,this);

			// one time, so delete
			for(itTasks = it->second.begin(); itTasks != it->second.end(); ++itTasks)
				delete (*itTasks);
			mMoreFormEndTasks.erase(it);
		}		
	}

	return status;
}